

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 float128_to_floatx80_x86_64(float128 a,float_status *status)

{
  commonNaNT a_00;
  float128 a_01;
  float128 a_02;
  float128 a_03;
  float128 a_04;
  floatx80 fVar1;
  commonNaNT local_60;
  uint64_t local_48;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  uint16_t local_10;
  
  a_local.low = a.high;
  status_local = (float_status *)a.low;
  _aExp = status;
  local_48 = extractFloat128Frac1(a);
  a_01.high = a_local.low;
  a_01.low = (uint64_t)status_local;
  aSig1 = extractFloat128Frac0(a_01);
  a_02.high = a_local.low;
  a_02.low = (uint64_t)status_local;
  aSig0._0_4_ = extractFloat128Exp(a_02);
  a_03.high = a_local.low;
  a_03.low = (uint64_t)status_local;
  aSig0._7_1_ = extractFloat128Sign(a_03);
  if ((int32_t)aSig0 == 0x7fff) {
    if (aSig1 == 0 && local_48 == 0) {
      fVar1 = packFloatx80(aSig0._7_1_,0x7fff,0x8000000000000000);
      local_10 = fVar1.high;
    }
    else {
      a_04.high = a_local.low;
      a_04.low = (uint64_t)status_local;
      float128ToCommonNaN(&local_60,a_04,_aExp);
      a_00.high = local_60.high;
      a_00.sign = local_60.sign;
      a_00._1_7_ = local_60._1_7_;
      a_00.low = local_60.low;
      fVar1 = commonNaNToFloatx80(a_00,_aExp);
      local_10 = fVar1.high;
    }
  }
  else {
    if ((int32_t)aSig0 == 0) {
      if (aSig1 == 0 && local_48 == 0) {
        fVar1 = packFloatx80(aSig0._7_1_,0,0);
        local_10 = fVar1.high;
        goto LAB_004d6505;
      }
      normalizeFloat128Subnormal(aSig1,local_48,(int32_t *)&aSig0,&aSig1,&local_48);
    }
    else {
      aSig1 = aSig1 | 0x1000000000000;
    }
    shortShift128Left(aSig1,local_48,0xf,&aSig1,&local_48);
    fVar1 = roundAndPackFloatx80_x86_64('P',aSig0._7_1_,(int32_t)aSig0,aSig1,local_48,_aExp);
    local_10 = fVar1.high;
  }
LAB_004d6505:
  a_local.high = fVar1.low;
  fVar1.high = local_10;
  fVar1.low = a_local.high;
  return fVar1;
}

Assistant:

floatx80 float128_to_floatx80(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloatx80(float128ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    else {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shortShift128Left( aSig0, aSig1, 15, &aSig0, &aSig1 );
    return roundAndPackFloatx80(80, aSign, aExp, aSig0, aSig1, status);

}